

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddColor
          (X3DImporter *this,aiMesh *pMesh,
          list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pColors,bool pColorPerVertex)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  size_type sVar5;
  DeadlyImportError *pDVar6;
  ulong uVar7;
  ulong uVar8;
  aiColor4D *paVar9;
  reference paVar10;
  aiColor4t<float> *local_248;
  aiColor4t<float> *local_218;
  size_t vi_e;
  size_t vi;
  size_t fi;
  string local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  _List_const_iterator<aiColor4t<float>_> local_118;
  ulong local_110;
  size_t i;
  string local_100;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  _List_const_iterator<aiColor4t<float>_> local_30;
  const_iterator col_it;
  bool pColorPerVertex_local;
  list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pColors_local;
  aiMesh *pMesh_local;
  X3DImporter *this_local;
  
  col_it._M_node._7_1_ = pColorPerVertex;
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::begin(pColors);
  if ((col_it._M_node._7_1_ & 1) == 0) {
    sVar5 = std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::size(pColors);
    if (sVar5 < pMesh->mNumFaces) {
      pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      sVar5 = std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::size
                        (pColors);
      to_string<unsigned_long>(&local_1b8,sVar5);
      std::operator+(&local_198,"MeshGeometry_AddColor1. Colors count(",&local_1b8);
      std::operator+(&local_178,&local_198,") can not be less than Faces count(");
      to_string<unsigned_int>(&local_1d8,pMesh->mNumFaces);
      std::operator+(&local_158,&local_178,&local_1d8);
      std::operator+(&local_138,&local_158,").");
      DeadlyImportError::DeadlyImportError(pDVar6,&local_138);
      __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    uVar7 = CONCAT44(0,pMesh->mNumVertices);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar7;
    uVar8 = SUB168(auVar3 * ZEXT816(0x10),0);
    if (SUB168(auVar3 * ZEXT816(0x10),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    paVar9 = (aiColor4D *)operator_new__(uVar8);
    if (uVar7 != 0) {
      local_248 = paVar9;
      do {
        aiColor4t<float>::aiColor4t(local_248);
        local_248 = local_248 + 1;
      } while (local_248 != paVar9 + uVar7);
    }
    pMesh->mColors[0] = paVar9;
    for (vi = 0; vi < pMesh->mNumFaces; vi = vi + 1) {
      vi_e = 0;
      uVar1 = pMesh->mFaces[vi].mNumIndices;
      for (; vi_e < uVar1; vi_e = vi_e + 1) {
        paVar10 = std::_List_const_iterator<aiColor4t<float>_>::operator*(&local_30);
        paVar9 = pMesh->mColors[0] + pMesh->mFaces[vi].mIndices[vi_e];
        fVar4 = paVar10->g;
        paVar9->r = paVar10->r;
        paVar9->g = fVar4;
        fVar4 = paVar10->a;
        paVar9->b = paVar10->b;
        paVar9->a = fVar4;
      }
      std::_List_const_iterator<aiColor4t<float>_>::operator++(&local_30);
    }
  }
  else {
    sVar5 = std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::size(pColors);
    if (sVar5 < pMesh->mNumVertices) {
      i._7_1_ = 1;
      pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      sVar5 = std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::size
                        (pColors);
      to_string<unsigned_long>(&local_d0,sVar5);
      std::operator+(&local_b0,"MeshGeometry_AddColor1. Colors count(",&local_d0);
      std::operator+(&local_90,&local_b0,") can not be less than Vertices count(");
      to_string<unsigned_int>(&local_100,pMesh->mNumVertices);
      std::operator+(&local_70,&local_90,&local_100);
      std::operator+(&local_50,&local_70,").");
      DeadlyImportError::DeadlyImportError(pDVar6,&local_50);
      i._7_1_ = 0;
      __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    uVar7 = CONCAT44(0,pMesh->mNumVertices);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar7;
    uVar8 = SUB168(auVar2 * ZEXT816(0x10),0);
    if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    paVar9 = (aiColor4D *)operator_new__(uVar8);
    if (uVar7 != 0) {
      local_218 = paVar9;
      do {
        aiColor4t<float>::aiColor4t(local_218);
        local_218 = local_218 + 1;
      } while (local_218 != paVar9 + uVar7);
    }
    pMesh->mColors[0] = paVar9;
    for (local_110 = 0; local_110 < pMesh->mNumVertices; local_110 = local_110 + 1) {
      local_118._M_node =
           (_List_node_base *)std::_List_const_iterator<aiColor4t<float>_>::operator++(&local_30,0);
      paVar10 = std::_List_const_iterator<aiColor4t<float>_>::operator*(&local_118);
      paVar9 = pMesh->mColors[0] + local_110;
      fVar4 = paVar10->g;
      paVar9->r = paVar10->r;
      paVar9->g = fVar4;
      fVar4 = paVar10->a;
      paVar9->b = paVar10->b;
      paVar9->a = fVar4;
    }
  }
  return;
}

Assistant:

void X3DImporter::MeshGeometry_AddColor(aiMesh& pMesh, const std::list<aiColor4D>& pColors, const bool pColorPerVertex) const
{
    std::list<aiColor4D>::const_iterator col_it = pColors.begin();

	if(pColorPerVertex)
	{
		if(pColors.size() < pMesh.mNumVertices)
		{
			throw DeadlyImportError("MeshGeometry_AddColor1. Colors count(" + to_string(pColors.size()) + ") can not be less than Vertices count(" +
									to_string(pMesh.mNumVertices) +  ").");
		}

		// copy colors to mesh
		pMesh.mColors[0] = new aiColor4D[pMesh.mNumVertices];
		for(size_t i = 0; i < pMesh.mNumVertices; i++) pMesh.mColors[0][i] = *col_it++;
	}// if(pColorPerVertex)
	else
	{
		if(pColors.size() < pMesh.mNumFaces)
		{
			throw DeadlyImportError("MeshGeometry_AddColor1. Colors count(" + to_string(pColors.size()) + ") can not be less than Faces count(" +
									to_string(pMesh.mNumFaces) +  ").");
		}

		// copy colors to mesh
		pMesh.mColors[0] = new aiColor4D[pMesh.mNumVertices];
		for(size_t fi = 0; fi < pMesh.mNumFaces; fi++)
		{
			// apply color to all vertices of face
            for ( size_t vi = 0, vi_e = pMesh.mFaces[ fi ].mNumIndices; vi < vi_e; vi++ )
            {
                pMesh.mColors[ 0 ][ pMesh.mFaces[ fi ].mIndices[ vi ] ] = *col_it;
            }

			++col_it;
		}
	}// if(pColorPerVertex) else
}